

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
InsertHint<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>_>
::TestBody(InsertHint<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>_>
           *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 rhs;
  mt19937_64 *__urng;
  long lVar3;
  char *pcVar4;
  _Head_base<0UL,_const_int_&,_false> *p_Var5;
  T val2;
  T val;
  TypeParam m;
  AssertHelper local_788;
  undefined1 local_780 [8];
  _Head_base<0UL,_const_int_&,_false> local_778;
  _Head_base<0UL,_const_int_&,_false> local_770;
  undefined1 local_768 [8];
  undefined1 local_760 [8];
  Inner *local_758;
  __native_type local_750;
  AssertHelper local_728;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  local_720;
  
  local_768 = (undefined1  [8])
              hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()
                        ((Generator<std::pair<const_int,_int>,_void> *)&local_720);
  lVar3 = 0x68;
  do {
    *(undefined8 *)((long)&local_758 + lVar3) = 0;
    *(undefined8 *)((long)&local_750 + lVar3) = 0;
    *(undefined8 *)(local_768 + lVar3) = 0;
    *(undefined8 *)(local_760 + lVar3) = 0;
    *(undefined8 *)((long)&local_778._M_head_impl + lVar3) = 0;
    *(undefined8 *)((long)&local_770._M_head_impl + lVar3) = 0;
    *(undefined8 *)((long)&local_788.data_ + lVar3) = 0;
    *(undefined8 *)(local_780 + lVar3) = 0;
    *(undefined8 *)((long)&local_750 + lVar3 + 8) = 0;
    *(undefined8 *)((long)&local_750 + lVar3 + 0x18) = 0;
    *(long *)((long)&local_750 + lVar3 + 0x20) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)&local_728.data_ + lVar3) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)
     ((long)&local_720.sets_._M_elems[0].super_Lockable.super_mutex.super___mutex_base._M_mutex +
     lVar3) = 0;
    lVar3 = lVar3 + 0x70;
  } while (lVar3 != 0x768);
  local_770._M_head_impl = (int *)(local_768 + 4);
  local_778._M_head_impl = (int *)local_768;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_768._0_4_;
  p_Var5 = &local_778;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::
  emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int_const&>>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
              *)local_760,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&local_720,local_778._M_head_impl,
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,(tuple<const_int_&> *)p_Var5,
             (tuple<const_int_&> *)&local_770);
  rhs = local_750._8_8_;
  if (local_760 == (undefined1  [8])0x0) {
    local_778._M_head_impl = local_778._M_head_impl & 0xffffffffffffff00;
    local_770._M_head_impl = (int *)0x0;
    testing::Message::Message((Message *)local_780);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_760,(internal *)&local_778,(AssertionResult *)"it != m.end()","false"
               ,"true",(char *)p_Var5);
    testing::internal::AssertHelper::AssertHelper
              (&local_788,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x47,(char *)local_760);
    testing::internal::AssertHelper::operator=(&local_788,(Message *)local_780);
    testing::internal::AssertHelper::~AssertHelper(&local_788);
    if (local_760 != (undefined1  [8])&local_750) {
      operator_delete((void *)local_760,(ulong)(local_750.__align + 1));
    }
    if ((long *)CONCAT44(local_780._4_4_,local_780._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_780._4_4_,local_780._0_4_) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_770._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_770,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_770._M_head_impl);
    }
  }
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_760,"val","*it",(pair<const_int,_int> *)local_768,
             (pair<const_int,_int> *)rhs);
  if (local_760[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_778);
    if (local_758 == (Inner *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)(local_758->super_Lockable).super_mutex.super___mutex_base._M_mutex.__align;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_780,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x48,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_780,(Message *)&local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_780);
    if ((long *)local_778._M_head_impl != (long *)0x0) {
      (**(code **)(*(long *)local_778._M_head_impl + 8))();
    }
  }
  if (local_758 != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_758,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_758);
  }
  local_760 = (undefined1  [8])0x7fffffff00000000;
  __urng = hash_internal::GetSharedRng();
  local_780._4_4_ =
       std::uniform_int_distribution<int>::operator()
                 ((uniform_int_distribution<int> *)local_760,__urng,(param_type *)local_760);
  local_770._M_head_impl = (int *)(local_780 + 4);
  local_780._0_4_ = local_768._0_4_;
  local_778._M_head_impl = (int *)local_780;
  p_Var5 = &local_778;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(int)local_768._0_4_;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::
  emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int_const&>>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
              *)local_760,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&local_720,local_778._M_head_impl,
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,(tuple<const_int_&> *)p_Var5,
             (tuple<const_int_&> *)&local_770);
  if (local_760 == (undefined1  [8])0x0) {
    local_778._M_head_impl = local_778._M_head_impl & 0xffffffffffffff00;
    local_770._M_head_impl = (int *)0x0;
    testing::Message::Message((Message *)&local_788);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_760,(internal *)&local_778,(AssertionResult *)"it != m.end()","false"
               ,"true",(char *)p_Var5);
    testing::internal::AssertHelper::AssertHelper
              (&local_728,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x4b,(char *)local_760);
    testing::internal::AssertHelper::operator=(&local_728,(Message *)&local_788);
    testing::internal::AssertHelper::~AssertHelper(&local_728);
    if (local_760 != (undefined1  [8])&local_750) {
      operator_delete((void *)local_760,(ulong)(local_750.__align + 1));
    }
    if (local_788.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_788.data_ + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_770._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_770,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_770._M_head_impl);
    }
  }
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_760,"val","*it",(pair<const_int,_int> *)local_768,
             (pair<const_int,_int> *)local_750._8_8_);
  if (local_760[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_778);
    if (local_758 == (Inner *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)(local_758->super_Lockable).super_mutex.super___mutex_base._M_mutex.__align;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_788,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x4c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_788,(Message *)&local_778);
    testing::internal::AssertHelper::~AssertHelper(&local_788);
    if ((long *)local_778._M_head_impl != (long *)0x0) {
      (**(code **)(*(long *)local_778._M_head_impl + 8))();
    }
  }
  if (local_758 != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_758,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_758);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::~parallel_hash_set(&local_720);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, InsertHint) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  auto it = m.insert(m.end(), val);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  it = m.insert(it, val2);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
}